

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::SetupBackgroundSweep(HeapInfo *this,RecyclerSweep *recyclerSweep)

{
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  RecyclerSweep *recyclerSweep_local;
  HeapInfo *this_local;
  
  for (local_1c = 0; local_1c < 0x30; local_1c = local_1c + 1) {
    HeapBucketGroup<SmallAllocationBlockAttributes>::SetupBackgroundSweep
              (this->heapBuckets + local_1c,recyclerSweep);
  }
  for (local_20 = 0; local_20 < 0x1d; local_20 = local_20 + 1) {
    HeapBucketGroup<MediumAllocationBlockAttributes>::SetupBackgroundSweep
              (this->mediumHeapBuckets + local_20,recyclerSweep);
  }
  return;
}

Assistant:

void
HeapInfo::SetupBackgroundSweep(RecyclerSweep& recyclerSweep)
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        this->heapBuckets[i].SetupBackgroundSweep(recyclerSweep);
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        this->mediumHeapBuckets[i].SetupBackgroundSweep(recyclerSweep);
    }
#endif
}